

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  pthread_t *__newthread;
  uint *__arg;
  pthread_t tid_consumer;
  int count [64];
  pthread_t tid_producer [64];
  pthread_t local_340;
  uint local_338 [64];
  pthread_t local_238 [65];
  
  if (argc != 3) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x4a);
    err_quit("usage: prodcons2 [nitems] [nthreads]");
  }
  uVar1 = atoi(argv[1]);
  uVar5 = (ulong)uVar1;
  if (999999 < (int)uVar1) {
    uVar5 = 1000000;
  }
  nitems = (int)uVar5;
  uVar2 = atoi(argv[2]);
  uVar1 = 0x40;
  if ((int)uVar2 < 0x40) {
    uVar1 = uVar2;
  }
  printf("nitems = %d, nthreads = %d\n",uVar5,(ulong)uVar1);
  if (999999 < nitems - 1U) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x51);
    err_quit("nitems = %d");
  }
  if ((int)uVar2 < 1) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
           );
    err_quit("nthreads = %d");
  }
  else {
    __newthread = local_238;
    __arg = local_338;
    uVar5 = 0;
    do {
      *__arg = 0;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,producer,__arg);
      if (iVar3 != 0) {
        fprintf(_stderr,"[%s:%d]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
               );
        err_quit("Failed to create thread %d");
      }
      uVar5 = uVar5 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 1;
    } while (uVar1 != uVar5);
  }
  uVar4 = 0;
  iVar3 = pthread_create(&local_340,(pthread_attr_t *)0x0,consumer,(void *)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x5c);
    err_quit("Failed to create consumer thread");
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      iVar3 = pthread_join(local_238[uVar5],(void **)0x0);
      if (iVar3 != 0) {
        fprintf(_stderr,"[%s:%d]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
                ,0x60);
        err_quit("Failed to join thread %d(tid = %ld)",uVar5 & 0xffffffff,local_238[uVar5]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar5 = 0;
      uVar4 = 0;
      do {
        printf("tid_producer[%d] = %ld, count[%d] = %d\n",uVar5 & 0xffffffff,local_238[uVar5],
               uVar5 & 0xffffffff,(ulong)local_338[uVar5]);
        uVar4 = uVar4 + local_338[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  printf("sum = %d, nitems = %d\n",(ulong)uVar4,(ulong)(uint)nitems);
  iVar3 = pthread_join(local_340,(void **)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x6c);
    err_quit("Failed to join consumer thread (tid = %ld)",local_340);
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv) {
    int nthreads, i, count[MAX_THREADS];
    pthread_t tid_producer[MAX_THREADS], tid_consumer;

    ASSERT_ERR_QUIT(3 == argc, "usage: prodcons2 [nitems] [nthreads]");

    nitems = min(atoi(argv[1]), MAX_ITEMS);
    nthreads = min(atoi(argv[2]), MAX_THREADS);

    printf("nitems = %d, nthreads = %d\n", nitems, nthreads);

    ASSERT_ERR_QUIT(nitems > 0 && nitems <= MAX_ITEMS, "nitems = %d", nitems);
    ASSERT_ERR_QUIT(nthreads > 0 && nthreads <= MAX_THREADS, 
        "nthreads = %d", nthreads);

    for (i = 0; i < nthreads; ++i) {
        count[i] = 0;
        ASSERT_ERR_QUIT(0 == pthread_create(&tid_producer[i], NULL,
            &producer, &count[i]), "Failed to create thread %d", i);
    }

    ASSERT_ERR_QUIT(0 == pthread_create(&tid_consumer, NULL, &consumer, NULL),
        "Failed to create consumer thread");

    for (i = 0; i < nthreads; ++i) {
        ASSERT_ERR_QUIT(0 == pthread_join(tid_producer[i], NULL), 
            "Failed to join thread %d(tid = %ld)", i, (long)(tid_producer[i]));
    }

    int sum = 0;
    for (i = 0; i < nthreads; ++i) {
        printf("tid_producer[%d] = %ld, count[%d] = %d\n", i, (long)(tid_producer[i]), i, count[i]);
        sum += count[i];
    }

    printf("sum = %d, nitems = %d\n", sum, nitems);

    ASSERT_ERR_QUIT(0 == pthread_join(tid_consumer, NULL), "Failed to join "
        "consumer thread (tid = %ld)", (long)tid_consumer);
    
    exit(0);
}